

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DatatypeValidatorFactory::expandRegistryToFullSchemaSet(DatatypeValidatorFactory *this)

{
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *this_00;
  DatatypeValidator *pDVar1;
  DecimalDatatypeValidator *this_01;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *pRVar2;
  KVStringPair *pKVar3;
  DatatypeValidator *pDVar4;
  size_t in_RSI;
  size_t sVar5;
  undefined1 *puVar6;
  undefined8 *size;
  undefined6 *size_00;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *facets;
  DatatypeValidator *dv;
  DatatypeValidatorFactory *this_local;
  
  this_00 = (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)
            XMemory::operator_new((XMemory *)0x38,in_RSI);
  sVar5 = 0x1d;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::RefHashTableOf
            (this_00,0x1d,XMLPlatformUtils::fgMemoryManager);
  fBuiltInRegistry = this_00;
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,sVar5);
  StringDatatypeValidator::StringDatatypeValidator
            ((StringDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_STRING,
             (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  puVar6 = SchemaSymbols::fgDT_STRING;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_STRING,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)puVar6);
  NOTATIONDatatypeValidator::NOTATIONDatatypeValidator
            ((NOTATIONDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)XMLUni::fgNotationString,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA)
  ;
  puVar6 = XMLUni::fgNotationString;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,XMLUni::fgNotationString,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x68,(size_t)puVar6);
  AnySimpleTypeDatatypeValidator::AnySimpleTypeDatatypeValidator
            ((AnySimpleTypeDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_ANYSIMPLETYPE,
             (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  puVar6 = SchemaSymbols::fgDT_ANYSIMPLETYPE;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_ANYSIMPLETYPE,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x68,(size_t)puVar6);
  BooleanDatatypeValidator::BooleanDatatypeValidator
            ((BooleanDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_BOOLEAN,
             (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  puVar6 = SchemaSymbols::fgDT_BOOLEAN;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_BOOLEAN,pDVar1);
  this_01 = (DecimalDatatypeValidator *)XMemory::operator_new((XMemory *)0xa8,(size_t)puVar6);
  DecimalDatatypeValidator::DecimalDatatypeValidator(this_01,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            ((DatatypeValidator *)this_01,(XMLCh *)SchemaSymbols::fgDT_DECIMAL,
             (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  puVar6 = SchemaSymbols::fgDT_DECIMAL;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_DECIMAL,(DatatypeValidator *)this_01);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)puVar6);
  HexBinaryDatatypeValidator::HexBinaryDatatypeValidator
            ((HexBinaryDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_HEXBINARY,
             (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  puVar6 = SchemaSymbols::fgDT_HEXBINARY;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_HEXBINARY,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)puVar6);
  Base64BinaryDatatypeValidator::Base64BinaryDatatypeValidator
            ((Base64BinaryDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_BASE64BINARY,
             (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  puVar6 = SchemaSymbols::fgDT_BASE64BINARY;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_BASE64BINARY,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar6);
  DoubleDatatypeValidator::DoubleDatatypeValidator
            ((DoubleDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_DOUBLE,
             (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  puVar6 = SchemaSymbols::fgDT_DOUBLE;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_DOUBLE,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar6);
  FloatDatatypeValidator::FloatDatatypeValidator
            ((FloatDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_FLOAT,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA
            );
  puVar6 = SchemaSymbols::fgDT_FLOAT;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_FLOAT,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)puVar6);
  AnyURIDatatypeValidator::AnyURIDatatypeValidator
            ((AnyURIDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_ANYURI,
             (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  puVar6 = SchemaSymbols::fgDT_ANYURI;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_ANYURI,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)puVar6);
  QNameDatatypeValidator::QNameDatatypeValidator
            ((QNameDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_QNAME,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA
            );
  puVar6 = SchemaSymbols::fgDT_QNAME;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_QNAME,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar6);
  DateTimeDatatypeValidator::DateTimeDatatypeValidator
            ((DateTimeDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_DATETIME,
             (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  puVar6 = SchemaSymbols::fgDT_DATETIME;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_DATETIME,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar6);
  DateDatatypeValidator::DateDatatypeValidator
            ((DateDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_DATE,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA)
  ;
  puVar6 = SchemaSymbols::fgDT_DATE;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_DATE,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar6);
  TimeDatatypeValidator::TimeDatatypeValidator
            ((TimeDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_TIME,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA)
  ;
  puVar6 = SchemaSymbols::fgDT_TIME;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_TIME,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar6);
  DayDatatypeValidator::DayDatatypeValidator
            ((DayDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_DAY,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  puVar6 = SchemaSymbols::fgDT_DAY;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_DAY,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar6);
  MonthDatatypeValidator::MonthDatatypeValidator
            ((MonthDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_MONTH,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA
            );
  puVar6 = SchemaSymbols::fgDT_MONTH;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_MONTH,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar6);
  MonthDayDatatypeValidator::MonthDayDatatypeValidator
            ((MonthDayDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_MONTHDAY,
             (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  puVar6 = SchemaSymbols::fgDT_MONTHDAY;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_MONTHDAY,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar6);
  YearDatatypeValidator::YearDatatypeValidator
            ((YearDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_YEAR,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA)
  ;
  puVar6 = SchemaSymbols::fgDT_YEAR;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_YEAR,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar6);
  YearMonthDatatypeValidator::YearMonthDatatypeValidator
            ((YearMonthDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_YEARMONTH,
             (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  puVar6 = SchemaSymbols::fgDT_YEARMONTH;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_YEARMONTH,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar6);
  DurationDatatypeValidator::DurationDatatypeValidator
            ((DurationDatatypeValidator *)pDVar1,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_DURATION,
             (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  puVar6 = SchemaSymbols::fgDT_DURATION;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_DURATION,pDVar1);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 3;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,3,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_WHITESPACE,(XMLCh *)SchemaSymbols::fgWS_REPLACE,
             XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_WHITESPACE,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_STRING);
  puVar6 = SchemaSymbols::fgDT_NORMALIZEDSTRING;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_NORMALIZEDSTRING,pDVar1,pRVar2,
             (RefArrayVectorOf<char16_t> *)0x0,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 3;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,3,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_WHITESPACE,(XMLCh *)SchemaSymbols::fgWS_COLLAPSE,
             XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_WHITESPACE,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_NORMALIZEDSTRING);
  puVar6 = SchemaSymbols::fgDT_TOKEN;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_TOKEN,pDVar1,pRVar2,(RefArrayVectorOf<char16_t> *)0x0
             ,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)puVar6);
  pDVar4 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_TOKEN);
  NameDatatypeValidator::NameDatatypeValidator
            ((NameDatatypeValidator *)pDVar1,pDVar4,
             (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0,
             (RefArrayVectorOf<char16_t> *)0x0,0,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_NAME,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA)
  ;
  puVar6 = SchemaSymbols::fgDT_NAME;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_NAME,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)puVar6);
  pDVar4 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_NAME);
  NCNameDatatypeValidator::NCNameDatatypeValidator
            ((NCNameDatatypeValidator *)pDVar1,pDVar4,
             (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0,
             (RefArrayVectorOf<char16_t> *)0x0,0,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)SchemaSymbols::fgDT_NCNAME,
             (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  puVar6 = SchemaSymbols::fgDT_NCNAME;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,SchemaSymbols::fgDT_NCNAME,pDVar1);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 3;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,3,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_PATTERN,L"\\c+",XMLPlatformUtils::fgMemoryManager)
  ;
  puVar6 = SchemaSymbols::fgELT_PATTERN;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_PATTERN,pKVar3);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,(size_t)puVar6);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_WHITESPACE,(XMLCh *)SchemaSymbols::fgWS_COLLAPSE,
             XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_WHITESPACE,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_TOKEN);
  puVar6 = XMLUni::fgNmTokenString;
  createDatatypeValidator
            (this,(XMLCh *)XMLUni::fgNmTokenString,pDVar1,pRVar2,(RefArrayVectorOf<char16_t> *)0x0,
             false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 2;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,2,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MINLENGTH,L"1",XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MINLENGTH,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)XMLUni::fgNmTokenString);
  puVar6 = XMLUni::fgNmTokensString;
  createDatatypeValidator
            (this,(XMLCh *)XMLUni::fgNmTokensString,pDVar1,pRVar2,(RefArrayVectorOf<char16_t> *)0x0,
             true,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 3;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,3,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_PATTERN,(XMLCh *)XMLUni::fgLangPattern,
             XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_PATTERN,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_TOKEN);
  puVar6 = SchemaSymbols::fgDT_LANGUAGE;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_LANGUAGE,pDVar1,pRVar2,
             (RefArrayVectorOf<char16_t> *)0x0,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 3;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,3,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_FRACTIONDIGITS,L"0",
             XMLPlatformUtils::fgMemoryManager);
  puVar6 = SchemaSymbols::fgELT_FRACTIONDIGITS;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_FRACTIONDIGITS,pKVar3);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,(size_t)puVar6);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_PATTERN,(XMLCh *)fgIntegerPattern,
             XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_PATTERN,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_DECIMAL);
  puVar6 = SchemaSymbols::fgDT_INTEGER;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_INTEGER,pDVar1,pRVar2,
             (RefArrayVectorOf<char16_t> *)0x0,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 2;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,2,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MAXINCLUSIVE,L"0",
             XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_INTEGER);
  puVar6 = SchemaSymbols::fgDT_NONPOSITIVEINTEGER;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_NONPOSITIVEINTEGER,pDVar1,pRVar2,
             (RefArrayVectorOf<char16_t> *)0x0,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 2;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,2,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MAXINCLUSIVE,L"-1",
             XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_NONPOSITIVEINTEGER);
  puVar6 = SchemaSymbols::fgDT_NEGATIVEINTEGER;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_NEGATIVEINTEGER,pDVar1,pRVar2,
             (RefArrayVectorOf<char16_t> *)0x0,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 2;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,2,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MAXINCLUSIVE,(XMLCh *)XMLUni::fgLongMaxInc,
             XMLPlatformUtils::fgMemoryManager);
  puVar6 = SchemaSymbols::fgELT_MAXINCLUSIVE;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar3);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,(size_t)puVar6);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MININCLUSIVE,(XMLCh *)XMLUni::fgLongMinInc,
             XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MININCLUSIVE,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_INTEGER);
  puVar6 = SchemaSymbols::fgDT_LONG;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_LONG,pDVar1,pRVar2,(RefArrayVectorOf<char16_t> *)0x0,
             false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 2;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,2,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MAXINCLUSIVE,(XMLCh *)XMLUni::fgIntMaxInc,
             XMLPlatformUtils::fgMemoryManager);
  puVar6 = SchemaSymbols::fgELT_MAXINCLUSIVE;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar3);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,(size_t)puVar6);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MININCLUSIVE,(XMLCh *)XMLUni::fgIntMinInc,
             XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MININCLUSIVE,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_LONG);
  size = &SchemaSymbols::fgDT_INT;
  createDatatypeValidator
            (this,L"int",pDVar1,pRVar2,(RefArrayVectorOf<char16_t> *)0x0,false,0,false,
             XMLPlatformUtils::fgMemoryManager);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)size);
  sVar5 = 2;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,2,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MAXINCLUSIVE,(XMLCh *)XMLUni::fgShortMaxInc,
             XMLPlatformUtils::fgMemoryManager);
  puVar6 = SchemaSymbols::fgELT_MAXINCLUSIVE;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar3);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,(size_t)puVar6);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MININCLUSIVE,(XMLCh *)XMLUni::fgShortMinInc,
             XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MININCLUSIVE,pKVar3);
  pDVar1 = getDatatypeValidator(this,L"int");
  puVar6 = SchemaSymbols::fgDT_SHORT;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_SHORT,pDVar1,pRVar2,(RefArrayVectorOf<char16_t> *)0x0
             ,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 2;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,2,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MAXINCLUSIVE,L"127",
             XMLPlatformUtils::fgMemoryManager);
  puVar6 = SchemaSymbols::fgELT_MAXINCLUSIVE;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar3);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,(size_t)puVar6);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MININCLUSIVE,(XMLCh *)XMLUni::fgByteMinInc,
             XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MININCLUSIVE,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_SHORT);
  puVar6 = SchemaSymbols::fgDT_BYTE;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_BYTE,pDVar1,pRVar2,(RefArrayVectorOf<char16_t> *)0x0,
             false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 2;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,2,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MININCLUSIVE,L"0",
             XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MININCLUSIVE,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_INTEGER);
  puVar6 = SchemaSymbols::fgDT_NONNEGATIVEINTEGER;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_NONNEGATIVEINTEGER,pDVar1,pRVar2,
             (RefArrayVectorOf<char16_t> *)0x0,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 2;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,2,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MAXINCLUSIVE,(XMLCh *)XMLUni::fgULongMaxInc,
             XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_NONNEGATIVEINTEGER);
  puVar6 = SchemaSymbols::fgDT_ULONG;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_ULONG,pDVar1,pRVar2,(RefArrayVectorOf<char16_t> *)0x0
             ,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 2;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,2,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MAXINCLUSIVE,(XMLCh *)XMLUni::fgUIntMaxInc,
             XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_ULONG);
  puVar6 = SchemaSymbols::fgDT_UINT;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_UINT,pDVar1,pRVar2,(RefArrayVectorOf<char16_t> *)0x0,
             false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 2;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,2,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MAXINCLUSIVE,(XMLCh *)XMLUni::fgUShortMaxInc,
             XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_UINT);
  puVar6 = SchemaSymbols::fgDT_USHORT;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_USHORT,pDVar1,pRVar2,
             (RefArrayVectorOf<char16_t> *)0x0,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 2;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,2,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MAXINCLUSIVE,L"255",
             XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_USHORT);
  puVar6 = SchemaSymbols::fgDT_UBYTE;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_UBYTE,pDVar1,pRVar2,(RefArrayVectorOf<char16_t> *)0x0
             ,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 2;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,2,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MININCLUSIVE,L"1",
             XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MININCLUSIVE,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_NONNEGATIVEINTEGER);
  puVar6 = SchemaSymbols::fgDT_POSITIVEINTEGER;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_POSITIVEINTEGER,pDVar1,pRVar2,
             (RefArrayVectorOf<char16_t> *)0x0,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)puVar6);
  pDVar4 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_NCNAME);
  IDDatatypeValidator::IDDatatypeValidator
            ((IDDatatypeValidator *)pDVar1,pDVar4,
             (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0,
             (RefArrayVectorOf<char16_t> *)0x0,0,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar1,L"ID",(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  size_00 = &XMLUni::fgIDString;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&XMLUni::fgIDString,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)size_00);
  pDVar4 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_NCNAME);
  IDREFDatatypeValidator::IDREFDatatypeValidator
            ((IDREFDatatypeValidator *)pDVar1,pDVar4,
             (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0,
             (RefArrayVectorOf<char16_t> *)0x0,0,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)XMLUni::fgIDRefString,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  puVar6 = XMLUni::fgIDRefString;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,XMLUni::fgIDRefString,pDVar1);
  pDVar1 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)puVar6);
  pDVar4 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_NCNAME);
  ENTITYDatatypeValidator::ENTITYDatatypeValidator
            ((ENTITYDatatypeValidator *)pDVar1,pDVar4,
             (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0,
             (RefArrayVectorOf<char16_t> *)0x0,0,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar1,(XMLCh *)XMLUni::fgEntityString,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  puVar6 = XMLUni::fgEntityString;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,XMLUni::fgEntityString,pDVar1);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 2;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,2,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MINLENGTH,L"1",XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MINLENGTH,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)XMLUni::fgIDRefString);
  puVar6 = XMLUni::fgIDRefsString;
  createDatatypeValidator
            (this,(XMLCh *)XMLUni::fgIDRefsString,pDVar1,pRVar2,(RefArrayVectorOf<char16_t> *)0x0,
             true,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar2 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar6);
  sVar5 = 2;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
            (pRVar2,2,XMLPlatformUtils::fgMemoryManager);
  pKVar3 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar5);
  KVStringPair::KVStringPair
            (pKVar3,(XMLCh *)SchemaSymbols::fgELT_MINLENGTH,L"1",XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar2,SchemaSymbols::fgELT_MINLENGTH,pKVar3);
  pDVar1 = getDatatypeValidator(this,(XMLCh *)XMLUni::fgEntityString);
  createDatatypeValidator
            (this,(XMLCh *)XMLUni::fgEntitiesString,pDVar1,pRVar2,(RefArrayVectorOf<char16_t> *)0x0,
             true,0,false,XMLPlatformUtils::fgMemoryManager);
  initCanRepRegistory(this);
  return;
}

Assistant:

void DatatypeValidatorFactory::expandRegistryToFullSchemaSet()
{
    //Initialize common Schema/DTD Datatype validator set
    fBuiltInRegistry = new RefHashTableOf<DatatypeValidator>(29);

    DatatypeValidator *dv = new StringDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_STRING, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_STRING, dv);

    dv = new NOTATIONDatatypeValidator();
    dv->setTypeName(XMLUni::fgNotationString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) XMLUni::fgNotationString, dv);

    dv = new AnySimpleTypeDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_ANYSIMPLETYPE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_ANYSIMPLETYPE, dv);

    dv = new BooleanDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_BOOLEAN, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_BOOLEAN, dv);

    dv = new DecimalDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_DECIMAL, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_DECIMAL, dv);

    dv = new HexBinaryDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_HEXBINARY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_HEXBINARY, dv);

    dv = new Base64BinaryDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_BASE64BINARY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_BASE64BINARY, dv);

    dv = new DoubleDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_DOUBLE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_DOUBLE, dv);

    dv = new FloatDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_FLOAT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_FLOAT, dv);

    dv = new AnyURIDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_ANYURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_ANYURI, dv);

    dv = new QNameDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_QNAME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_QNAME, dv);

    dv = new DateTimeDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_DATETIME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_DATETIME, dv);

    dv = new DateDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_DATE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_DATE, dv);

    dv = new TimeDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_TIME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_TIME, dv);

    dv = new DayDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_DAY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_DAY, dv);

    dv = new MonthDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_MONTH, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_MONTH, dv);

    dv = new MonthDayDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_MONTHDAY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_MONTHDAY, dv);

    dv = new YearDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_YEAR, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_YEAR, dv);

    dv = new YearMonthDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_YEARMONTH, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_YEARMONTH, dv);

    dv = new DurationDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_DURATION, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_DURATION, dv);

    // REVISIT
    // We are creating a lot of Hashtables for the facets of the different
    // validators. It's better to have some kind of a memory pool and ask
    // the pool to give us a new instance of the hashtable.
    RefHashTableOf<KVStringPair>* facets = new RefHashTableOf<KVStringPair>(3);

    // Create 'normalizedString' datatype validator
    facets->put((void*) SchemaSymbols::fgELT_WHITESPACE,
                new KVStringPair(SchemaSymbols::fgELT_WHITESPACE, SchemaSymbols::fgWS_REPLACE));

    createDatatypeValidator(SchemaSymbols::fgDT_NORMALIZEDSTRING,
                            getDatatypeValidator(SchemaSymbols::fgDT_STRING),
                            facets, 0, false, 0, false);

    // Create 'token' datatype validator
    facets = new RefHashTableOf<KVStringPair>(3);
    facets->put((void*) SchemaSymbols::fgELT_WHITESPACE,
                new KVStringPair(SchemaSymbols::fgELT_WHITESPACE, SchemaSymbols::fgWS_COLLAPSE));

    createDatatypeValidator(SchemaSymbols::fgDT_TOKEN,
                            getDatatypeValidator(SchemaSymbols::fgDT_NORMALIZEDSTRING),
                            facets, 0, false, 0, false);


    dv = new NameDatatypeValidator(getDatatypeValidator(SchemaSymbols::fgDT_TOKEN), 0, 0, 0);
    dv->setTypeName(SchemaSymbols::fgDT_NAME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_NAME, dv);


    dv = new NCNameDatatypeValidator(getDatatypeValidator(SchemaSymbols::fgDT_NAME), 0, 0, 0);
    dv->setTypeName(SchemaSymbols::fgDT_NCNAME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_NCNAME, dv);

    // Create 'NMTOKEN' datatype validator
    facets = new RefHashTableOf<KVStringPair>(3);

    facets->put((void*) SchemaSymbols::fgELT_PATTERN ,
                new KVStringPair(SchemaSymbols::fgELT_PATTERN,fgTokPattern));
    facets->put((void*) SchemaSymbols::fgELT_WHITESPACE,
                new KVStringPair(SchemaSymbols::fgELT_WHITESPACE, SchemaSymbols::fgWS_COLLAPSE));

    createDatatypeValidator(XMLUni::fgNmTokenString,
                            getDatatypeValidator(SchemaSymbols::fgDT_TOKEN),facets, 0, false, 0, false);

    // Create 'NMTOKENS' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);
    facets->put((void*) SchemaSymbols::fgELT_MINLENGTH,
                new KVStringPair(SchemaSymbols::fgELT_MINLENGTH, XMLUni::fgValueOne));

    createDatatypeValidator(XMLUni::fgNmTokensString,
                            getDatatypeValidator(XMLUni::fgNmTokenString), facets, 0, true, 0, false);

    // Create 'language' datatype validator
    facets = new RefHashTableOf<KVStringPair>(3);

    facets->put((void*) SchemaSymbols::fgELT_PATTERN,
                new KVStringPair(SchemaSymbols::fgELT_PATTERN, XMLUni::fgLangPattern));

    createDatatypeValidator(SchemaSymbols::fgDT_LANGUAGE,
                            getDatatypeValidator(SchemaSymbols::fgDT_TOKEN),
                            facets, 0, false, 0, false);

    // Create 'integer' datatype validator
    facets = new RefHashTableOf<KVStringPair>(3);

    facets->put((void*) SchemaSymbols::fgELT_FRACTIONDIGITS,
                new KVStringPair(SchemaSymbols::fgELT_FRACTIONDIGITS, XMLUni::fgValueZero));

    facets->put((void*) SchemaSymbols::fgELT_PATTERN,
                new KVStringPair(SchemaSymbols::fgELT_PATTERN, fgIntegerPattern));

    createDatatypeValidator(SchemaSymbols::fgDT_INTEGER,
                            getDatatypeValidator(SchemaSymbols::fgDT_DECIMAL),
                            facets, 0, false, 0, false);

    // Create 'nonPositiveInteger' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgValueZero));

    createDatatypeValidator(SchemaSymbols::fgDT_NONPOSITIVEINTEGER,
                            getDatatypeValidator(SchemaSymbols::fgDT_INTEGER),
                            facets, 0, false, 0, false);

    // Create 'negativeInteger' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgNegOne));

    createDatatypeValidator(SchemaSymbols::fgDT_NEGATIVEINTEGER,
                            getDatatypeValidator(SchemaSymbols::fgDT_NONPOSITIVEINTEGER),
                            facets, 0, false, 0, false);

    // Create 'long' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgLongMaxInc));
    facets->put((void*) SchemaSymbols::fgELT_MININCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MININCLUSIVE, XMLUni::fgLongMinInc));

    createDatatypeValidator(SchemaSymbols::fgDT_LONG,
                            getDatatypeValidator(SchemaSymbols::fgDT_INTEGER),
                            facets, 0, false, 0, false);

    // Create 'int' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgIntMaxInc));
    facets->put((void*) SchemaSymbols::fgELT_MININCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MININCLUSIVE, XMLUni::fgIntMinInc));

    createDatatypeValidator(SchemaSymbols::fgDT_INT,
                            getDatatypeValidator(SchemaSymbols::fgDT_LONG),
                            facets, 0, false, 0, false);

    // Create 'short' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgShortMaxInc));
    facets->put((void*) SchemaSymbols::fgELT_MININCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MININCLUSIVE, XMLUni::fgShortMinInc));

    createDatatypeValidator(SchemaSymbols::fgDT_SHORT,
                            getDatatypeValidator(SchemaSymbols::fgDT_INT),
                            facets, 0, false, 0 ,false);

    // Create 'byte' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgByteMaxInc));
    facets->put((void*) SchemaSymbols::fgELT_MININCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MININCLUSIVE, XMLUni::fgByteMinInc));

    createDatatypeValidator(SchemaSymbols::fgDT_BYTE,
                            getDatatypeValidator(SchemaSymbols::fgDT_SHORT),
                            facets, 0, false, 0, false);

    // Create 'nonNegativeInteger' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MININCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MININCLUSIVE, XMLUni::fgValueZero));

    createDatatypeValidator(SchemaSymbols::fgDT_NONNEGATIVEINTEGER,
                            getDatatypeValidator(SchemaSymbols::fgDT_INTEGER),
                            facets, 0, false, 0, false);

    // Create 'unsignedLong' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgULongMaxInc));

    createDatatypeValidator(SchemaSymbols::fgDT_ULONG,
                            getDatatypeValidator(SchemaSymbols::fgDT_NONNEGATIVEINTEGER),
                            facets, 0, false, 0, false);

    // Create 'unsignedInt' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgUIntMaxInc));

    createDatatypeValidator(SchemaSymbols::fgDT_UINT,
                            getDatatypeValidator(SchemaSymbols::fgDT_ULONG),
                            facets, 0, false, 0, false);

    // Create 'unsignedShort' datatypeValidator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgUShortMaxInc));

    createDatatypeValidator(SchemaSymbols::fgDT_USHORT,
                            getDatatypeValidator(SchemaSymbols::fgDT_UINT),
                            facets, 0, false, 0, false);

    // Create 'unsignedByte' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgUByteMaxInc));

    createDatatypeValidator(SchemaSymbols::fgDT_UBYTE,
                            getDatatypeValidator(SchemaSymbols::fgDT_USHORT),
                            facets, 0, false, 0, false);

    // Create 'positiveInteger' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MININCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MININCLUSIVE, XMLUni::fgValueOne));

    createDatatypeValidator(SchemaSymbols::fgDT_POSITIVEINTEGER,
                            getDatatypeValidator(SchemaSymbols::fgDT_NONNEGATIVEINTEGER),
                            facets, 0, false, 0, false);

    // Create 'ID', 'IDREF' and 'ENTITY' datatype validator
    dv = new IDDatatypeValidator(getDatatypeValidator(SchemaSymbols::fgDT_NCNAME), 0, 0, 0);
    dv->setTypeName(XMLUni::fgIDString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) XMLUni::fgIDString, dv);

    dv = new IDREFDatatypeValidator(getDatatypeValidator(SchemaSymbols::fgDT_NCNAME), 0, 0, 0);
    dv->setTypeName(XMLUni::fgIDRefString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) XMLUni::fgIDRefString, dv);

    dv = new ENTITYDatatypeValidator(getDatatypeValidator(SchemaSymbols::fgDT_NCNAME), 0, 0, 0);
    dv->setTypeName(XMLUni::fgEntityString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) XMLUni::fgEntityString, dv);

    facets = new RefHashTableOf<KVStringPair>(2);
    facets->put((void*) SchemaSymbols::fgELT_MINLENGTH,
                new KVStringPair(SchemaSymbols::fgELT_MINLENGTH, XMLUni::fgValueOne));

    // Create 'IDREFS' datatype validator
    createDatatypeValidator
      (
        XMLUni::fgIDRefsString
        , getDatatypeValidator(XMLUni::fgIDRefString)
        , facets
        , 0
        , true
        , 0
        , false
      );

    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MINLENGTH,
                new KVStringPair(SchemaSymbols::fgELT_MINLENGTH, XMLUni::fgValueOne));

    // Create 'ENTITIES' datatype validator
    createDatatypeValidator
      (
        XMLUni::fgEntitiesString
        , getDatatypeValidator(XMLUni::fgEntityString)
        , facets
        , 0
        , true
        , 0
        , false
      );

    initCanRepRegistory();
}